

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
__thiscall
google::protobuf::compiler::cpp::anon_unknown_0::ClassVars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,anon_unknown_0 *this,Descriptor *desc,Options *opts)

{
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  iterator iVar1;
  bool bVar2;
  DescriptorStringView psVar3;
  FileDescriptor *file;
  reference ppVar4;
  Options *opts_00;
  Descriptor *desc_00;
  iterator iVar5;
  iterator iVar6;
  anon_union_8_1_a8a14541_for_iterator_2 local_de8;
  Sub *local_db8;
  allocator<char> local_cd9;
  string local_cd8;
  Sub local_cb8;
  reference local_c00;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair_1;
  iterator __end3_1;
  iterator __begin3_1;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3_1;
  string local_ba8;
  Sub local_b88;
  reference local_ad0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  iterator __end3;
  iterator __begin3;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  string local_a78;
  byte local_a52;
  allocator<char> local_a51;
  AlphaNum local_a50;
  byte local_a19;
  string local_a18;
  AlphaNum local_9f8;
  undefined1 local_9c8 [72];
  Sub local_980;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  allocator<char> local_879;
  string local_878;
  string local_858;
  allocator<char> local_831;
  string local_830;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  string local_758;
  allocator<char> local_731;
  string local_730;
  string local_710;
  allocator<char> local_6d9;
  string local_6d8;
  Sub *local_6b8;
  Sub local_6b0;
  Sub local_5f8;
  Sub local_540;
  Sub local_488;
  Sub local_3d0;
  Sub local_318;
  Sub local_260;
  Sub local_1a8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  undefined1 local_21;
  undefined8 local_20;
  Options *opts_local;
  Descriptor *desc_local;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  *vars;
  
  local_21 = '\0';
  __range3._6_1_ = 1;
  local_6b8 = &local_6b0;
  local_20 = desc;
  opts_local = (Options *)this;
  desc_local = (Descriptor *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"pkg",&local_6d9);
  Namespace_abi_cxx11_(&local_710,(cpp *)opts_local,desc,opts);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_6b0,&local_6d8,&local_710);
  local_6b8 = &local_5f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"Msg",&local_731);
  ClassName_abi_cxx11_(&local_758,(cpp *)opts_local,(Descriptor *)0x0,SUB81(opts,0));
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_5f8,&local_730,&local_758);
  local_6b8 = &local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"pkg::Msg",&local_779);
  QualifiedClassName_abi_cxx11_(&local_7a0,(cpp *)opts_local,desc,opts);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_540,&local_778,&local_7a0);
  local_6b8 = &local_488;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"pkg.Msg",&local_7c1);
  psVar3 = Descriptor::full_name_abi_cxx11_((Descriptor *)opts_local);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_488,&local_7c0,psVar3);
  local_6b8 = &local_3d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"classname",&local_7e9);
  ClassName_abi_cxx11_(&local_810,(cpp *)opts_local,(Descriptor *)0x0,SUB81(opts,0));
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_3d0,&local_7e8,&local_810);
  local_6b8 = &local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"classtype",&local_831);
  QualifiedClassName_abi_cxx11_(&local_858,(cpp *)opts_local,desc,opts);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_318,&local_830,&local_858);
  local_6b8 = &local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,"full_name",&local_879);
  psVar3 = Descriptor::full_name_abi_cxx11_((Descriptor *)opts_local);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_260,&local_878,psVar3);
  local_6b8 = &local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"superclass",&local_8a1);
  SuperClassName_abi_cxx11_(&local_8c8,(cpp *)opts_local,desc,opts);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a8,&local_8a0,&local_8c8);
  local_6b8 = &local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_9c8 + 0x28),"WeakDescriptorSelfPin",
             (allocator<char> *)(local_9c8 + 0x27));
  file = Descriptor::file((Descriptor *)opts_local);
  local_a19 = 0;
  local_a52 = 0;
  bVar2 = UsingImplicitWeakDescriptor(file,(Options *)desc);
  if (bVar2) {
    StrongReferenceToType_abi_cxx11_(&local_a18,(cpp *)opts_local,desc,opts);
    local_a19 = 1;
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_9f8,&local_a18);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_a50,";");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_9c8,&local_9f8);
  }
  else {
    std::allocator<char>::allocator();
    local_a52 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_9c8,"",&local_a51);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_980,(string *)(local_9c8 + 0x28),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a78,";",(allocator<char> *)((long)&__range3 + 7));
  io::Printer::Sub::WithSuffix(&local_f0,&local_980,&local_a78);
  __range3._6_1_ = 0;
  local_38 = &local_6b0;
  local_30 = 9;
  std::allocator<google::protobuf::io::Printer::Sub>::allocator
            ((allocator<google::protobuf::io::Printer::Sub> *)((long)&__range3 + 5));
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,
         (allocator<google::protobuf::io::Printer::Sub> *)((long)&__range3 + 5));
  std::allocator<google::protobuf::io::Printer::Sub>::~allocator
            ((allocator<google::protobuf::io::Printer::Sub> *)((long)&__range3 + 5));
  local_db8 = (Sub *)&local_38;
  do {
    local_db8 = local_db8 + -1;
    io::Printer::Sub::~Sub(local_db8);
  } while (local_db8 != &local_6b0);
  std::__cxx11::string::~string((string *)&local_a78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
  io::Printer::Sub::~Sub(&local_980);
  std::__cxx11::string::~string((string *)local_9c8);
  if ((local_a52 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a51);
  }
  if ((local_a19 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a18);
  }
  std::__cxx11::string::~string((string *)(local_9c8 + 0x28));
  std::allocator<char>::~allocator((allocator<char> *)(local_9c8 + 0x27));
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator(&local_879);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  MessageVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__begin3.field_1,(cpp *)opts_local,desc_00);
  iVar5 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__begin3.field_1);
  __begin3.ctrl_ = (ctrl_t *)iVar5.field_1;
  __end3.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)iVar5.ctrl_;
  iVar5 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__begin3.field_1);
  iVar1 = iVar5;
  while( true ) {
    __end3.ctrl_ = (ctrl_t *)iVar1.field_1;
    pair = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)iVar1.ctrl_;
    local_de8 = iVar5.field_1;
    opts_00 = (Options *)iVar5.ctrl_;
    bVar2 = absl::lts_20240722::container_internal::operator!=
                      ((iterator *)&__end3.field_1,(iterator *)&pair);
    if (!bVar2) break;
    ppVar4 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator*((iterator *)&__end3.field_1);
    local_ad0 = ppVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_ba8,&ppVar4->first,(allocator<char> *)((long)&__range3_1 + 7));
    io::Printer::Sub::Sub<std::__cxx11::string&>(&local_b88,&local_ba8,&local_ad0->second);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::push_back(__return_storage_ptr__,&local_b88);
    io::Printer::Sub::~Sub(&local_b88);
    std::__cxx11::string::~string((string *)&local_ba8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++((iterator *)&__end3.field_1);
    iVar1.field_1.slot_ = (slot_type *)__end3.ctrl_;
    iVar1.ctrl_ = (ctrl_t *)pair;
    iVar5.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_2)
         (anon_union_8_1_a8a14541_for_iterator_2)local_de8.slot_;
    iVar5.ctrl_ = (ctrl_t *)opts_00;
  }
  absl::lts_20240722::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__begin3.field_1);
  UnknownFieldsVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__begin3_1.field_1,(cpp *)opts_local,desc,opts_00);
  iVar5 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__begin3_1.field_1);
  __begin3_1.ctrl_ = (ctrl_t *)iVar5.field_1;
  __end3_1.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)iVar5.ctrl_;
  iVar6 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__begin3_1.field_1);
  while( true ) {
    __end3_1.ctrl_ = (ctrl_t *)iVar6.field_1;
    pair_1 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)iVar6.ctrl_;
    bVar2 = absl::lts_20240722::container_internal::operator!=
                      ((iterator *)&__end3_1.field_1,(iterator *)&pair_1);
    if (!bVar2) break;
    ppVar4 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator*((iterator *)&__end3_1.field_1);
    local_c00 = ppVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_cd8,&ppVar4->first,&local_cd9);
    io::Printer::Sub::Sub<std::__cxx11::string&>(&local_cb8,&local_cd8,&local_c00->second);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::push_back(__return_storage_ptr__,&local_cb8);
    io::Printer::Sub::~Sub(&local_cb8);
    std::__cxx11::string::~string((string *)&local_cd8);
    std::allocator<char>::~allocator(&local_cd9);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++((iterator *)&__end3_1.field_1);
    iVar6.field_1.slot_ = (slot_type *)__end3_1.ctrl_;
    iVar6.ctrl_ = (ctrl_t *)pair_1;
  }
  absl::lts_20240722::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__begin3_1.field_1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> ClassVars(const Descriptor* desc, Options opts) {
  std::vector<Sub> vars = {
      {"pkg", Namespace(desc, opts)},
      {"Msg", ClassName(desc, false)},
      {"pkg::Msg", QualifiedClassName(desc, opts)},
      {"pkg.Msg", desc->full_name()},

      // Old-style names, to be removed once all usages are gone in this and
      // other files.
      {"classname", ClassName(desc, false)},
      {"classtype", QualifiedClassName(desc, opts)},
      {"full_name", desc->full_name()},
      {"superclass", SuperClassName(desc, opts)},

      Sub("WeakDescriptorSelfPin",
          UsingImplicitWeakDescriptor(desc->file(), opts)
              ? absl::StrCat(StrongReferenceToType(desc, opts), ";")
              : "")
          .WithSuffix(";"),
  };

  for (auto& pair : MessageVars(desc)) {
    vars.push_back({std::string(pair.first), pair.second});
  }

  for (auto& pair : UnknownFieldsVars(desc, opts)) {
    vars.push_back({std::string(pair.first), pair.second});
  }

  return vars;
}